

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

int __thiscall TextFile::open(TextFile *this,char *__file,int __oflag,...)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  undefined7 extraout_var;
  TextFile *pTVar3;
  uintmax_t uVar4;
  Mode __fd;
  fpos<__mbstate_t> local_58;
  fpos<__mbstate_t> local_48;
  fpos<__mbstate_t> local_38;
  short local_23;
  char local_21;
  Encoding local_20;
  Mode MStack_1c;
  uchar numBuffer [3];
  Encoding defaultEncoding_local;
  Mode mode_local;
  TextFile *this_local;
  
  __fd = (Mode)__file;
  local_20 = __oflag;
  MStack_1c = __fd;
  bVar1 = ghc::filesystem::path::empty(&this->fileName);
  pTVar3 = (TextFile *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    this_local._7_1_ = 0;
    goto LAB_001a034f;
  }
  bVar1 = isOpen(this);
  if (bVar1) {
    close(this,__fd);
  }
  this->fromMemory = false;
  this->guessedEncoding = false;
  this->encoding = local_20;
  this->mode = MStack_1c;
  if (MStack_1c == Read) {
    _Var2 = std::operator|(_S_in,_S_bin);
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              (&this->stream,(char *)&this->fileName,_Var2);
    pTVar3 = (TextFile *)std::fstream::is_open();
    if (((ulong)pTVar3 & 1) == 0) {
      this_local._7_1_ = 0;
      goto LAB_001a034f;
    }
  }
  else if (MStack_1c == Write) {
    _Var2 = std::operator|(_S_out,_S_bin);
    _Var2 = std::operator|(_Var2,_S_trunc);
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              (&this->stream,(char *)&this->fileName,_Var2);
    pTVar3 = (TextFile *)std::fstream::is_open();
    if (((ulong)pTVar3 & 1) == 0) {
      this_local._7_1_ = 0;
      goto LAB_001a034f;
    }
    std::__cxx11::string::resize((ulong)&this->buf);
    if (this->encoding != ASCII) {
      this->encoding = UTF8;
      bufPut(this,-0x11);
      bufPut(this,-0x45);
      bufPut(this,-0x41);
    }
  }
  memset(&local_23,0,3);
  this->contentPos = 0;
  if (MStack_1c == Read) {
    uVar4 = ghc::filesystem::file_size(&this->fileName);
    this->size_ = uVar4;
    std::istream::read((char *)this,(long)&local_23);
    if (local_23 == -0x4411) {
      if (local_21 == -0x41) {
        this->encoding = UTF8;
        this->contentPos = 3;
      }
      else {
LAB_001a02f3:
        if (local_20 == GUESS) {
          this->encoding = UTF8;
          this->guessedEncoding = true;
        }
        std::fpos<__mbstate_t>::fpos(&local_58,0);
        this = (TextFile *)std::istream::seekg(this,local_58._M_off,local_58._M_state);
      }
    }
    else if (local_23 == -0x101) {
      this->encoding = UTF16LE;
      std::fpos<__mbstate_t>::fpos(&local_48,2);
      std::istream::seekg(this,local_48._M_off,local_48._M_state);
      this->contentPos = 2;
    }
    else {
      if (local_23 != -2) goto LAB_001a02f3;
      this->encoding = UTF16BE;
      std::fpos<__mbstate_t>::fpos(&local_38,2);
      std::istream::seekg(this,local_38._M_off,local_38._M_state);
      this->contentPos = 2;
    }
  }
  else if (local_20 == GUESS) {
    this->encoding = UTF8;
    this->guessedEncoding = true;
  }
  this_local._7_1_ = 1;
  pTVar3 = this;
LAB_001a034f:
  return (int)CONCAT71((int7)((ulong)pTVar3 >> 8),this_local._7_1_);
}

Assistant:

bool TextFile::open(Mode mode, Encoding defaultEncoding)
{
	if (fileName.empty())
		return false;

	if (isOpen())
		close();

	fromMemory = false;
	guessedEncoding = false;
	encoding = defaultEncoding;
	this->mode = mode;

	// open all files as binary due to unicode
	switch (mode)
	{
	case Read:
		stream.open(fileName, fs::fstream::in | fs::fstream::binary);

		if (!stream.is_open())
			return false;
		break;
	case Write:
		stream.open(fileName, fs::fstream::out | fs::fstream::binary | fs::fstream::trunc);

		if (!stream.is_open())
			return false;

		buf.resize(TEXTFILE_BUF_MAX_SIZE);
		if (encoding != ASCII)
		{
			encoding = UTF8;
			bufPut(char(0xEF));
			bufPut(char(0xBB));
			bufPut(char(0xBF));
		}
		break;
	}

	// detect encoding
	unsigned char numBuffer[3] = {0};
	contentPos = 0;

	if (mode == Read)
	{
		size_ = long(fs::file_size(fileName));

		stream.read(reinterpret_cast<char *>(numBuffer), 3);
		switch (numBuffer[0] | (numBuffer[1] << 8))
		{
		case 0xFFFE:
			encoding = UTF16BE;
			stream.seekg(2);
			contentPos = 2;
			break;
		case 0xFEFF:
			encoding = UTF16LE;
			stream.seekg(2);
			contentPos = 2;
			break;
		case 0xBBEF:
			if (numBuffer[2] == 0xBF)
			{
				encoding = UTF8;
				contentPos = 3;
				break;
			}
			[[fallthrough]];
		default:
			if (defaultEncoding == GUESS)
			{
				encoding = UTF8;
				guessedEncoding = true;
			}
			stream.seekg(0);
			break;
		}
	} else {
		if (defaultEncoding == GUESS)
		{
			encoding = UTF8;
			guessedEncoding = true;
		}
	}

	return true;
}